

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::JobManager::MakeBorderRouterChoice
          (Error *__return_storage_ptr__,JobManager *this,uint64_t aNid,BorderRouter *br)

{
  ushort uVar1;
  State SVar2;
  Status SVar3;
  char *pcVar4;
  BorderRouter *pBVar5;
  BorderRouter *pBVar6;
  char *pcVar7;
  pointer pBVar8;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  iterator __begin3;
  pointer pBVar9;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  BRArray brs;
  undefined1 local_148 [32];
  BRArray choice;
  pointer local_108;
  char *pcStack_100;
  size_t local_f8;
  undefined8 local_f0;
  format_string_checker<char> *local_e8;
  parse_func local_e0 [1];
  undefined1 local_d0 [40];
  pointer local_a8;
  char *pcStack_a0;
  Network nwk;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  brs.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  brs.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  brs.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  choice.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  choice.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  choice.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  persistent_storage::Network::Network(&nwk);
  SVar3 = persistent_storage::Registry::GetBorderRoutersInNetwork
                    ((this->mInterpreter->mRegistry).
                     super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,aNid,&brs);
  if (SVar3 == kSuccess) {
    if ((long)brs.
              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)brs.
              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x188) {
      persistent_storage::BorderRouter::operator=
                (br,brs.
                    super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                    ._M_impl.super__Vector_impl_data._M_start);
      goto LAB_00143acd;
    }
    SVar3 = persistent_storage::Registry::GetNetworkByXpan
                      ((this->mInterpreter->mRegistry).
                       super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,aNid,&nwk);
    pBVar8 = brs.
             super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (SVar3 == kSuccess) {
      pBVar5 = brs.
               super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (nwk.mCcm < 1) {
        for (pBVar9 = brs.
                      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pBVar5 = choice.
                     super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                     ._M_impl.super__Vector_impl_data._M_start, pBVar9 != pBVar8;
            pBVar9 = pBVar9 + 1) {
          if (((uint)(pBVar9->mAgent).mState & 7) != 0) {
            std::
            vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ::push_back(&choice,pBVar9);
          }
        }
      }
      else {
        for (; pBVar5 != brs.
                         super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                         ._M_impl.super__Vector_impl_data._M_finish; pBVar5 = pBVar5 + 1) {
          SVar2 = (pBVar5->mAgent).mState;
          if (((((uint)SVar2 & 0x18) != 0) && (((uint)SVar2 & 0x180) == 0x180)) &&
             (((uint)SVar2 & 7) != 0)) {
            persistent_storage::BorderRouter::operator=(br,pBVar5);
            goto LAB_00143acd;
          }
        }
        for (pBVar9 = brs.
                      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pBVar5 = choice.
                     super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                     ._M_impl.super__Vector_impl_data._M_start, pBVar9 != pBVar8;
            pBVar9 = pBVar9 + 1) {
          uVar1 = *(ushort *)&(pBVar9->mAgent).mState;
          if ((uVar1 & 7) != 0 && (char)uVar1 < '\0') {
            std::
            vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ::push_back(&choice,pBVar9);
          }
        }
      }
      for (; pBVar6 = choice.
                      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                      ._M_impl.super__Vector_impl_data._M_start,
          pBVar5 != choice.
                    super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pBVar5 = pBVar5 + 1) {
        SVar2 = (pBVar5->mAgent).mState;
        if (((uint)SVar2 & 0x60) != 0 && ((uint)SVar2 & 0x10) != 0) {
          persistent_storage::BorderRouter::operator=(br,pBVar5);
          goto LAB_00143acd;
        }
      }
      for (; pBVar8 = choice.
                      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                      ._M_impl.super__Vector_impl_data._M_start,
          pBVar6 != choice.
                    super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pBVar6 = pBVar6 + 1) {
        if (((uint)(pBVar6->mAgent).mState & 0x10) != 0) {
          persistent_storage::BorderRouter::operator=(br,pBVar6);
          goto LAB_00143acd;
        }
      }
      for (; pBVar8 != choice.
                       super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                       ._M_impl.super__Vector_impl_data._M_finish; pBVar8 = pBVar8 + 1) {
        if (((uint)(pBVar8->mAgent).mState & 0x18) != 0) {
          persistent_storage::BorderRouter::operator=(br,pBVar8);
          goto LAB_00143acd;
        }
      }
      local_108 = (pointer)((ulong)local_108 & 0xffffffff00000000);
      pcStack_100 = "no active BR found";
      local_f8 = 0x12;
      local_f0 = 0;
      local_e0[0] = (parse_func)0x0;
      pcVar4 = "no active BR found";
      local_e8 = (format_string_checker<char> *)&local_108;
      while (pcVar7 = pcVar4, pcVar7 != "") {
        pcVar4 = pcVar7 + 1;
        if (*pcVar7 == '}') {
          if ((pcVar4 == "") || (*pcVar4 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar4 = pcVar7 + 2;
        }
        else if (*pcVar7 == '{') {
          pcVar4 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar7,"",(format_string_checker<char> *)&local_108);
        }
      }
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)&local_108;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)local_148,(v10 *)"no active BR found",(string_view)ZEXT816(0x12),args_01)
      ;
      local_d0._0_4_ = kNotFound;
      std::__cxx11::string::string((string *)(local_d0 + 8),(string *)local_148);
      goto LAB_00143a8d;
    }
    local_108 = (pointer)CONCAT44(local_108._4_4_,0xd);
    pcStack_100 = "network not found by XPAN \'{}\'";
    local_f8 = 0x1e;
    local_f0 = 0x100000000;
    local_e0[0] = ::fmt::v10::detail::
                  parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    pcVar4 = "network not found by XPAN \'{}\'";
    local_e8 = (format_string_checker<char> *)&local_108;
    while (pcVar7 = pcVar4, pcVar7 != "") {
      pcVar4 = pcVar7 + 1;
      if (*pcVar7 == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = pcVar7 + 2;
      }
      else if (*pcVar7 == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (pcVar7,"",(format_string_checker<char> *)&local_108);
      }
    }
    utils::Hex<unsigned_long>((string *)&local_108,aNid);
    local_a8 = local_108;
    pcStack_a0 = pcStack_100;
    fmt_00.size_ = 0xd;
    fmt_00.data_ = (char *)0x1e;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_a8;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_148,(v10 *)"network not found by XPAN \'{}\'",fmt_00,args_00);
    local_d0._0_4_ = kNotFound;
    std::__cxx11::string::string((string *)(local_d0 + 8),(string *)local_148);
    Error::operator=(__return_storage_ptr__,(Error *)local_d0);
    std::__cxx11::string::~string((string *)(local_d0 + 8));
    std::__cxx11::string::~string((string *)local_148);
    this_00 = (string *)&local_108;
  }
  else {
    local_108 = (pointer)CONCAT44(local_108._4_4_,int_type);
    pcStack_100 = "br lookup failed with status={}";
    local_f8 = 0x1f;
    local_f0 = 0x100000000;
    local_e0[0] = ::fmt::v10::detail::
                  parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>;
    pcVar4 = "br lookup failed with status={}";
    local_e8 = (format_string_checker<char> *)&local_108;
    while (pcVar7 = pcVar4, pcVar7 != "") {
      pcVar4 = pcVar7 + 1;
      if (*pcVar7 == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = pcVar7 + 2;
      }
      else if (*pcVar7 == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,int>&>
                           (pcVar7,"",(format_string_checker<char> *)&local_108);
      }
    }
    local_108 = (pointer)(ulong)SVar3;
    fmt.size_ = 1;
    fmt.data_ = (char *)0x1f;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_108;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_148,(v10 *)"br lookup failed with status={}",fmt,args);
    local_d0._0_4_ = kRegistryError;
    std::__cxx11::string::string((string *)(local_d0 + 8),(string *)local_148);
LAB_00143a8d:
    Error::operator=(__return_storage_ptr__,(Error *)local_d0);
    std::__cxx11::string::~string((string *)(local_d0 + 8));
    this_00 = (string *)local_148;
  }
  std::__cxx11::string::~string(this_00);
LAB_00143acd:
  persistent_storage::Network::~Network(&nwk);
  std::
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ::~vector(&choice);
  std::
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ::~vector(&brs);
  return __return_storage_ptr__;
}

Assistant:

Error JobManager::MakeBorderRouterChoice(uint64_t aNid, BorderRouter &br)
{
    Error          error;
    BRArray        brs;
    BRArray        choice;
    Network        nwk;
    RegistryStatus status = mInterpreter.mRegistry->GetBorderRoutersInNetwork(aNid, brs);

    VerifyOrExit(status == RegistryStatus::kSuccess,
                 error = ERROR_REGISTRY_ERROR("br lookup failed with status={}", static_cast<int>(status)));
    if (brs.size() == 1)
    {
        // looks like not much of a choice
        br = brs.front();
        ExitNow();
    }
    status = mInterpreter.mRegistry->GetNetworkByXpan(aNid, nwk);
    VerifyOrExit(status == RegistryStatus::kSuccess,
                 error = ERROR_NOT_FOUND("network not found by XPAN '{}'", utils::Hex(aNid)));
    if (nwk.mCcm > 0) // Dealing with domain network
    {
        // - try to find active and connectable Primary BBR
        for (const auto &item : brs)
        {
            if (item.mAgent.mState.mBbrIsPrimary &&
                item.mAgent.mState.mConnectionMode > BorderAgent::State::ConnectionMode::kNotAllowed)
            {
                if (item.mAgent.mState.mBbrIsActive &&
                    item.mAgent.mState.mThreadIfStatus > BorderAgent::State::ThreadInterfaceStatus::kNotInitialized)
                {
                    /// @todo: ideally here we would make sure the
                    ///        Border Router's connection mode @ref
                    ///        BorderAgent::State::ConnectionMode::kX509Connection
                    ///        is specified, otherwise the announced
                    ///        BBR appears inconsistent with Thread
                    ///        spec. Although nothing we could do at
                    ///        runtime here, a warning message might
                    ///        be useful as an indication of a
                    ///        potential issue
                    br = item;
                    ExitNow();
                }
            }
        }
        // - go on with other active and connectable BBRs
        for (const auto &item : brs)
        {
            if (item.mAgent.mState.mBbrIsActive &&
                item.mAgent.mState.mConnectionMode > BorderAgent::State::ConnectionMode::kNotAllowed)
            {
                choice.push_back(item);
            }
        }
    }
    else // Dealing with standalone networks
    {
        // go on with connectable BRs
        for (const auto &item : brs)
        {
            if (item.mAgent.mState.mConnectionMode > BorderAgent::State::ConnectionMode::kNotAllowed)
            {
                choice.push_back(item);
            }
        }
    }

    // Below a final triage is done

    // - prefer br with high-availability
    for (const auto &item : choice)
    {
        if (item.mAgent.mState.mThreadIfStatus > BorderAgent::State::ThreadInterfaceStatus::kNotActive &&
            item.mAgent.mState.mAvailability > BorderAgent::State::Availability::kInfrequent)
        {
            br = item;
            ExitNow();
        }
    }
    // - prefer br with Thread Interface actively participating in communication
    for (const auto &item : choice)
    {
        if (item.mAgent.mState.mThreadIfStatus > BorderAgent::State::ThreadInterfaceStatus::kNotActive)
        {
            br = item;
            ExitNow();
        }
    }
    // - try to find br with Thread Interface at least enabled
    for (const auto &item : choice)
    {
        if (item.mAgent.mState.mThreadIfStatus > BorderAgent::State::ThreadInterfaceStatus::kNotInitialized)
        {
            br = item;
            ExitNow();
        }
    }
    error = ERROR_NOT_FOUND("no active BR found");
exit:
    return error;
}